

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_type
                 (lysc_ctx *ctx,lysp_node *context_node,lysp_type *type_p,lysc_node_leaf *leaf)

{
  long lVar1;
  LY_DATA_TYPE LVar2;
  lysp_module *plVar3;
  lys_depset_unres *plVar4;
  char *pcVar5;
  bool bVar6;
  LY_ERR LVar7;
  lysp_qname *in_RAX;
  undefined8 *object;
  lysc_type *plVar8;
  ulong uVar9;
  ulong uVar10;
  char **units;
  long lVar11;
  lysc_when **pplVar12;
  lysc_type **type;
  lysp_qname *dflt;
  
  type = &leaf->type;
  units = (char **)0x0;
  if (leaf->units == (char *)0x0) {
    units = &leaf->units;
  }
  dflt = in_RAX;
  LVar7 = lys_compile_type(ctx,context_node,(leaf->field_0).node.flags,(leaf->field_0).node.name,
                           type_p,type,units,&dflt);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  LOCK();
  (*type)->refcount = (*type)->refcount + 1;
  UNLOCK();
  if (((dflt != (lysp_qname *)0x0) &&
      ((undefined1  [80])((undefined1  [80])leaf->field_0 & (undefined1  [80])0x2000000) ==
       (undefined1  [80])0x0)) &&
     (LVar7 = lysc_unres_leaf_dflt_add(ctx,leaf,dflt), LVar7 != LY_SUCCESS)) {
    return LVar7;
  }
  plVar8 = *type;
  if ((ctx->compile_opts & 1) == 0) {
    plVar3 = type_p->pmod;
    lVar11 = 0x50;
    if ((ctx->compile_opts & 2) == 0) {
      lVar11 = 0x20;
    }
    plVar4 = ctx->unres;
    if (plVar8->basetype != LY_TYPE_LEAFREF) {
      if (plVar8->basetype != LY_TYPE_UNION) goto LAB_0014c1d6;
      pcVar5 = plVar8[1].name;
      uVar9 = 0;
      do {
        if (pcVar5 == (char *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = *(ulong *)(pcVar5 + -8);
        }
        if (uVar10 <= uVar9) goto LAB_0014c1d6;
        lVar1 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(int *)(*(long *)(pcVar5 + lVar1) + 0x18) != 0xe);
    }
    object = (undefined8 *)calloc(1,0x18);
    if (object != (undefined8 *)0x0) {
      *object = leaf;
      object[1] = plVar3;
      object[2] = ctx->ext;
      LVar7 = ly_set_add((ly_set *)((long)&(plVar4->whens).size + lVar11),object,'\x01',
                         (uint32_t *)0x0);
      if (LVar7 == LY_SUCCESS) {
        plVar8 = *type;
        goto LAB_0014c1d6;
      }
      free(object);
    }
    LVar7 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_leafref_add");
  }
  else {
LAB_0014c1d6:
    pplVar12 = (lysc_when **)0x1;
    if (plVar8->basetype == LY_TYPE_UNION) {
      type = (lysc_type **)plVar8[1].name;
      if (type == (lysc_type **)0x0) {
        return LY_SUCCESS;
      }
      pplVar12 = (lysc_when **)type[-1];
      if (pplVar12 == (lysc_when **)0x0) {
        return LY_SUCCESS;
      }
    }
    lVar11 = 0;
    bVar6 = false;
    do {
      LVar2 = type[lVar11]->basetype;
      if (LVar2 == LY_TYPE_EMPTY) {
        if (((leaf->field_0).node.nodetype == 8) && (ctx->pmod->version < 2)) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "Leaf-list of type \"empty\" is allowed only in YANG 1.1 modules.");
          return LY_EVALID;
        }
      }
      else if (bVar6) {
LAB_0014c226:
        bVar6 = true;
      }
      else if ((LVar2 == LY_TYPE_ENUM) || (LVar2 == LY_TYPE_BITS)) {
        if ((ctx->compile_opts & 3) != 0) goto LAB_0014c226;
        LVar7 = ly_set_add(&ctx->unres->disabled_bitenums,leaf,'\x01',(uint32_t *)0x0);
        bVar6 = true;
        if (LVar7 != LY_SUCCESS) {
          return LVar7;
        }
      }
      else {
        bVar6 = false;
      }
      lVar11 = lVar11 + 1;
    } while (pplVar12 != (lysc_when **)lVar11);
    LVar7 = LY_SUCCESS;
  }
  return LVar7;
}

Assistant:

static LY_ERR
lys_compile_node_type(struct lysc_ctx *ctx, struct lysp_node *context_node, struct lysp_type *type_p,
        struct lysc_node_leaf *leaf)
{
    struct lysp_qname *dflt;
    struct lysc_type **t;
    LY_ARRAY_COUNT_TYPE u, count;
    ly_bool in_unres = 0;

    LY_CHECK_RET(lys_compile_type(ctx, context_node, leaf->flags, leaf->name, type_p, &leaf->type,
            leaf->units ? NULL : &leaf->units, &dflt));
    LY_ATOMIC_INC_BARRIER(leaf->type->refcount);

    /* store default value, if any */
    if (dflt && !(leaf->flags & LYS_SET_DFLT)) {
        LY_CHECK_RET(lysc_unres_leaf_dflt_add(ctx, leaf, dflt));
    }

    /* store leafref(s) to be resolved */
    LY_CHECK_RET(lysc_unres_leafref_add(ctx, leaf, type_p->pmod));

    /* type-specific checks */
    if (leaf->type->basetype == LY_TYPE_UNION) {
        t = ((struct lysc_type_union *)leaf->type)->types;
        count = LY_ARRAY_COUNT(t);
    } else {
        t = &leaf->type;
        count = 1;
    }
    for (u = 0; u < count; ++u) {
        if (t[u]->basetype == LY_TYPE_EMPTY) {
            if ((leaf->nodetype == LYS_LEAFLIST) && (ctx->pmod->version < LYS_VERSION_1_1)) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Leaf-list of type \"empty\" is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else if (!in_unres && ((t[u]->basetype == LY_TYPE_BITS) || (t[u]->basetype == LY_TYPE_ENUM))) {
            /* store in unres for all disabled bits/enums to be removed */
            LY_CHECK_RET(lysc_unres_bitenum_add(ctx, leaf));
            in_unres = 1;
        }
    }

    return LY_SUCCESS;
}